

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variables.hh
# Opt level: O2

void __thiscall
tchecker::
variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::declare(variables_t<unsigned_int,_tchecker::clock_info_t,_tchecker::index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,uint id,string *name,clock_info_t *info)

{
  invalid_argument *this_00;
  uint id_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  char local_30;
  
  id_local = id;
  index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::add(&this->_index,&id_local,name);
  local_78._M_dataplus._M_p = (pointer)CONCAT44((info->super_size_info_t)._size,id_local);
  boost::container::flat_map<unsigned_int,_tchecker::clock_info_t,_std::less<unsigned_int>,_void>::
  insert((flat_map<unsigned_int,_tchecker::clock_info_t,_std::less<unsigned_int>,_void> *)
         &stack0xffffffffffffffc8,(value_type *)&this->_info);
  if (local_30 != '\0') {
    return;
  }
  index_t<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::erase(&this->_index,&id_local);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::operator+(&local_58,"Variable ",name);
  std::operator+(&local_78,&local_58," cannot be declared");
  std::invalid_argument::invalid_argument(this_00,(string *)&local_78);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void declare(ID id, std::string const & name, INFO const & info)
  {
    try {
      _index.add(id, name);
      auto && ok = _info.insert(std::make_pair(id, info)).second;
      if (!ok) {
        _index.erase(id);
        throw std::invalid_argument("Variable " + name + " cannot be declared");
      }
    }
    catch (std::exception const & e) {
      throw std::invalid_argument("Variable " + name + " cannot be declared");
    }
  }